

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoModeImpl.cpp
# Opt level: O2

vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *
sf::priv::VideoModeImpl::getFullscreenModes(void)

{
  int iVar1;
  int iVar2;
  Display *display;
  long lVar3;
  long lVar4;
  long lVar5;
  __normal_iterator<sf::VideoMode_*,_std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>_>
  _Var6;
  ostream *poVar7;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *in_RDI;
  uint *puVar8;
  int j;
  uint uVar9;
  Rotation currentRotation;
  int nbDepths;
  int nbSizes;
  int version;
  short local_62;
  int local_60;
  int local_5c;
  long local_58;
  Display *local_50;
  uint *local_48;
  VideoMode local_40;
  undefined1 local_34 [4];
  
  (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  display = OpenDisplay();
  if (display == (Display *)0x0) {
    poVar7 = err();
    poVar7 = std::operator<<(poVar7,
                             "Failed to connect to the X server while trying to get the supported video modes"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    iVar1 = *(int *)(display + 0xe0);
    iVar2 = XQueryExtension(display,"RANDR",local_34,local_34,local_34);
    if (iVar2 == 0) {
      poVar7 = err();
      poVar7 = std::operator<<(poVar7,
                               "Failed to use the XRandR extension while trying to get the supported video modes"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      lVar3 = XRRGetScreenInfo(display,*(undefined8 *)
                                        (*(long *)(display + 0xe8) + 0x10 + (long)iVar1 * 0x80));
      if (lVar3 == 0) {
        poVar7 = err();
        poVar7 = std::operator<<(poVar7,
                                 "Failed to retrieve the screen configuration while trying to get the supported video modes"
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      else {
        lVar4 = XRRConfigSizes(lVar3,&local_5c);
        if ((lVar4 != 0) && (0 < local_5c)) {
          local_60 = 0;
          lVar5 = XListDepths(display,iVar1);
          if (0 < local_60 && lVar5 != 0) {
            local_48 = (uint *)(lVar4 + 4);
            local_58 = lVar3;
            local_50 = display;
            for (lVar4 = 0; lVar4 < local_60; lVar4 = lVar4 + 1) {
              puVar8 = local_48;
              for (lVar3 = 0; lVar3 < local_5c; lVar3 = lVar3 + 1) {
                VideoMode::VideoMode(&local_40,puVar8[-1],*puVar8,*(uint *)(lVar5 + lVar4 * 4));
                XRRConfigRotations(local_58,&local_62);
                if ((local_62 == 8) || (local_62 == 2)) {
                  uVar9 = local_40.height;
                  local_40.height = local_40.width;
                  local_40.width = uVar9;
                }
                _Var6 = std::
                        __find_if<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,__gnu_cxx::__ops::_Iter_equals_val<sf::VideoMode_const>>
                                  ((in_RDI->
                                   super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                                   (in_RDI->
                                   super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>
                                   )._M_impl.super__Vector_impl_data._M_finish,&local_40);
                if (_Var6._M_current ==
                    (in_RDI->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::push_back
                            (in_RDI,&local_40);
                }
                puVar8 = puVar8 + 4;
              }
            }
            XFree(lVar5);
            lVar3 = local_58;
            display = local_50;
          }
        }
        XRRFreeScreenConfigInfo(lVar3);
      }
    }
    CloseDisplay(display);
  }
  return in_RDI;
}

Assistant:

std::vector<VideoMode> VideoModeImpl::getFullscreenModes()
{
    std::vector<VideoMode> modes;

    // Open a connection with the X server
    Display* display = OpenDisplay();
    if (display)
    {
        // Retrieve the default screen number
        int screen = DefaultScreen(display);

        // Check if the XRandR extension is present
        int version;
        if (XQueryExtension(display, "RANDR", &version, &version, &version))
        {
            // Get the current configuration
            XRRScreenConfiguration* config = XRRGetScreenInfo(display, RootWindow(display, screen));
            if (config)
            {
                // Get the available screen sizes
                int nbSizes;
                XRRScreenSize* sizes = XRRConfigSizes(config, &nbSizes);
                if (sizes && (nbSizes > 0))
                {
                    // Get the list of supported depths
                    int nbDepths = 0;
                    int* depths = XListDepths(display, screen, &nbDepths);
                    if (depths && (nbDepths > 0))
                    {
                        // Combine depths and sizes to fill the array of supported modes
                        for (int i = 0; i < nbDepths; ++i)
                        {
                            for (int j = 0; j < nbSizes; ++j)
                            {
                                // Convert to VideoMode
                                VideoMode mode(sizes[j].width, sizes[j].height, depths[i]);

                                Rotation currentRotation;
                                XRRConfigRotations(config, &currentRotation);

                                if (currentRotation == RR_Rotate_90 || currentRotation == RR_Rotate_270)
                                    std::swap(mode.width, mode.height);

                                // Add it only if it is not already in the array
                                if (std::find(modes.begin(), modes.end(), mode) == modes.end())
                                    modes.push_back(mode);
                            }
                        }

                        // Free the array of depths
                        XFree(depths);
                    }
                }

                // Free the configuration instance
                XRRFreeScreenConfigInfo(config);
            }
            else
            {
                // Failed to get the screen configuration
                err() << "Failed to retrieve the screen configuration while trying to get the supported video modes" << std::endl;
            }
        }
        else
        {
            // XRandr extension is not supported: we cannot get the video modes
            err() << "Failed to use the XRandR extension while trying to get the supported video modes" << std::endl;
        }

        // Close the connection with the X server
        CloseDisplay(display);
    }
    else
    {
        // We couldn't connect to the X server
        err() << "Failed to connect to the X server while trying to get the supported video modes" << std::endl;
    }

    return modes;
}